

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O0

void sesschan_notify_remote_exit(Seat *seat)

{
  SeatVtable *pSVar1;
  int iVar2;
  Seat *ctx;
  bool bVar3;
  ptrlen pVar4;
  ptrlen msg;
  int signum;
  ptrlen signame;
  char *sigmsg;
  _Bool got_signal;
  sesschan *sess;
  Seat *seat_local;
  
  ctx = seat + -6;
  if (seat[0xac].vt != (SeatVtable *)0x0) {
    bVar3 = false;
    if (((ulong)(seat[0xb4].vt)->stripctrl_new & 1) == 0) {
      pVar4 = pty_backend_exit_signame((Backend *)seat[0xac].vt,(char **)&signame.len);
      signame.ptr = (void *)pVar4.len;
      if (signame.ptr != (void *)0x0) {
        if (signame.len == 0) {
          signame.len = (size_t)dupstr("");
        }
        pSVar1 = ctx->vt;
        msg = ptrlen_from_asciz((char *)signame.len);
        sshfwd_send_exit_signal((SshChannel *)pSVar1,pVar4,false,msg);
        bVar3 = true;
      }
      safefree((void *)signame.len);
    }
    else {
      iVar2 = pty_backend_exit_signum((Backend *)seat[0xac].vt);
      bVar3 = -1 < iVar2;
      if (bVar3) {
        pSVar1 = ctx->vt;
        pVar4 = make_ptrlen("",0);
        sshfwd_send_exit_signal_numeric((SshChannel *)pSVar1,iVar2,false,pVar4);
      }
    }
    if (!bVar3) {
      pSVar1 = ctx->vt;
      iVar2 = backend_exitcode((Backend *)seat[0xac].vt);
      sshfwd_send_exit_status((SshChannel *)pSVar1,iVar2);
    }
    *(undefined1 *)((long)&seat[0xa6].vt + 2) = 1;
    queue_toplevel_callback(sesschan_check_close_callback,ctx);
  }
  return;
}

Assistant:

static void sesschan_notify_remote_exit(Seat *seat)
{
    sesschan *sess = container_of(seat, sesschan, seat);

    if (!sess->backend)
        return;

    bool got_signal = false;
    if (!sess->ssc->exit_signal_numeric) {
        char *sigmsg;
        ptrlen signame = pty_backend_exit_signame(sess->backend, &sigmsg);

        if (signame.len) {
            if (!sigmsg)
                sigmsg = dupstr("");

            sshfwd_send_exit_signal(
                sess->c, signame, false, ptrlen_from_asciz(sigmsg));

            got_signal = true;
        }

        sfree(sigmsg);
    } else {
        int signum = pty_backend_exit_signum(sess->backend);

        if (signum >= 0) {
            sshfwd_send_exit_signal_numeric(sess->c, signum, false,
                                            PTRLEN_LITERAL(""));
            got_signal = true;
        }
    }

    if (!got_signal)
        sshfwd_send_exit_status(sess->c, backend_exitcode(sess->backend));

    sess->seen_exit = true;
    queue_toplevel_callback(sesschan_check_close_callback, sess);
}